

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void check_input(uchar **from0,size_t n0)

{
  int iVar1;
  ostream *poVar2;
  size_t i;
  ulong uVar3;
  size_t i_1;
  
  for (uVar3 = 1; uVar3 < n0; uVar3 = uVar3 + 1) {
    iVar1 = cmp(from0[uVar3 - 1],from0[uVar3]);
    if (0 < iVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"Oops: \'\'");
      poVar2 = std::operator<<(poVar2,(char *)from0[uVar3 - 1]);
      poVar2 = std::operator<<(poVar2,"\'\' > \'\'");
      poVar2 = std::operator<<(poVar2,(char *)from0[uVar3]);
      std::operator<<(poVar2,"\'\'\n");
    }
  }
  uVar3 = 1;
  do {
    if (n0 <= uVar3) {
      return;
    }
    iVar1 = cmp(from0[uVar3 - 1],from0[uVar3]);
    uVar3 = uVar3 + 1;
  } while (iVar1 < 1);
  __assert_fail("cmp(from0[i-1],from0[i])<=0",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                ,0x6c,"void check_input(unsigned char **, size_t)");
}

Assistant:

static void
check_input(unsigned char** from0, size_t n0)
{
	(void) from0;
	(void) n0;
#ifndef NDEBUG
	for(size_t i=1;i<n0;++i)if(cmp(from0[i-1],from0[i])>0){
		debug()<<"Oops: ''"<<from0[i-1]<<"'' > ''"<<from0[i]<<"''\n";}
	for(size_t i=1;i<n0;++i)assert(cmp(from0[i-1],from0[i])<=0);
#endif
}